

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O3

long ssl_callback_ctrl(BIO *bio,int cmd,BIO_info_cb *fp)

{
  long lVar1;
  BIO *b;
  
  if ((SSL *)bio->ptr == (SSL *)0x0) {
    lVar1 = 0;
  }
  else {
    lVar1 = -1;
    if (cmd != 0xe) {
      b = SSL_get_rbio((SSL *)bio->ptr);
      lVar1 = BIO_callback_ctrl(b,cmd,(fp *)fp);
      return lVar1;
    }
  }
  return lVar1;
}

Assistant:

static long ssl_callback_ctrl(BIO *bio, int cmd, BIO_info_cb *fp) {
  SSL *ssl = get_ssl(bio);
  if (ssl == NULL) {
    return 0;
  }

  switch (cmd) {
    case BIO_CTRL_SET_CALLBACK:
      return -1;

    default:
      return BIO_callback_ctrl(SSL_get_rbio(ssl), cmd, fp);
  }
}